

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  uv_buf_t uVar2;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  char *local_a20;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  uv_write_t write_req;
  int bidir;
  int r;
  uint i;
  uv_buf_t buf;
  uchar ubuf [1023];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uv_os_fd_t fds_stdout [2];
  uv_os_fd_t fds_stdin [2];
  uv_stdio_container_t child_stdio [2];
  uv_process_t child_req;
  
  init_process_options("spawn_helper9",exit_cb);
  loop_00 = uv_default_loop();
  iVar1 = uv_pipe_init(loop_00,(uv_pipe_t *)&pipe_stdout_child.pipe_fname,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7db,"uv_pipe_init(loop, &pipe_stdin_child, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_init(loop_00,(uv_pipe_t *)&pipe_stdin_parent.pipe_fname,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7dc,"uv_pipe_init(loop, &pipe_stdout_child, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_init(loop_00,(uv_pipe_t *)&pipe_stdout_parent.pipe_fname,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7dd,"uv_pipe_init(loop, &pipe_stdin_parent, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_init(loop_00,(uv_pipe_t *)(ubuf + 0x3f8),0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7de,"uv_pipe_init(loop, &pipe_stdout_parent, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe(fds_stdout,0,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e0,"uv_pipe(fds_stdin, 0, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe((uv_os_fd_t *)&pipe_stdin_child.pipe_fname,0,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e1,"uv_pipe(fds_stdout, 0, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open((uv_pipe_t *)&pipe_stdout_child.pipe_fname,fds_stdout[0]);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e3,"uv_pipe_open(&pipe_stdin_child, fds_stdin[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open((uv_pipe_t *)&pipe_stdin_parent.pipe_fname,pipe_stdin_child.pipe_fname._4_4_)
  ;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e4,"uv_pipe_open(&pipe_stdout_child, fds_stdout[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open((uv_pipe_t *)&pipe_stdout_parent.pipe_fname,fds_stdout[1]);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e5,"uv_pipe_open(&pipe_stdin_parent, fds_stdin[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open((uv_pipe_t *)(ubuf + 0x3f8),(uv_os_fd_t)pipe_stdin_child.pipe_fname);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e6,"uv_pipe_open(&pipe_stdout_parent, fds_stdout[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdout_child.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e7,"uv_is_readable((uv_stream_t*) &pipe_stdin_child)");
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_parent.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e8,"uv_is_writable((uv_stream_t*) &pipe_stdout_child)");
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdout_parent.pipe_fname);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7e9,"uv_is_writable((uv_stream_t*) &pipe_stdin_parent)");
    abort();
  }
  iVar1 = uv_is_readable((uv_stream_t *)(ubuf + 0x3f8));
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7ea,"uv_is_readable((uv_stream_t*) &pipe_stdout_parent)");
    abort();
  }
  write_req.bufsml[3].len._4_4_ = uv_is_writable((uv_stream_t *)&pipe_stdout_child.pipe_fname);
  iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdin_parent.pipe_fname);
  if ((long)iVar1 != (long)write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7ed,"uv_is_readable((uv_stream_t*) &pipe_stdout_child)","==","bidir",(long)iVar1,"=="
            ,(long)write_req.bufsml[3].len._4_4_);
    abort();
  }
  iVar1 = uv_is_readable((uv_stream_t *)&pipe_stdout_parent.pipe_fname);
  if ((long)iVar1 != (long)write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7ee,"uv_is_readable((uv_stream_t*) &pipe_stdin_parent)","==","bidir",(long)iVar1,"=="
            ,(long)write_req.bufsml[3].len._4_4_);
    abort();
  }
  iVar1 = uv_is_writable((uv_stream_t *)(ubuf + 0x3f8));
  if ((long)iVar1 != (long)write_req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7ef,"uv_is_writable((uv_stream_t*) &pipe_stdout_parent)","==","bidir",(long)iVar1,
            "==",(long)write_req.bufsml[3].len._4_4_);
    abort();
  }
  fds_stdin[0] = 4;
  child_stdio[0]._0_8_ = &pipe_stdout_child.pipe_fname;
  child_stdio[0].data.file = 4;
  child_stdio[1]._0_8_ = &pipe_stdin_parent.pipe_fname;
  options.stdio = (uv_stdio_container_t *)fds_stdin;
  options.stdio_count = 2;
  iVar1 = uv_spawn(loop_00,(uv_process_t *)&child_stdio[1].data,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x7fa,"uv_spawn(loop, &child_req, &options)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_close((uv_handle_t *)&pipe_stdout_child.pipe_fname,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&pipe_stdin_parent.pipe_fname,(uv_close_cb)0x0);
  uVar2 = uv_buf_init((char *)&buf.len,0x3ff);
  eval_a_14 = (int64_t)uVar2.base;
  _r = (char *)eval_a_14;
  local_a20 = (char *)uVar2.len;
  buf.base = local_a20;
  for (bidir = 0; (uint)bidir < 0x3ff; bidir = bidir + 1) {
    ubuf[(ulong)(uint)bidir - 8] = (uchar)bidir;
  }
  memset(output,0,0x3ff);
  iVar1 = uv_write((uv_write_t *)&loop,(uv_stream_t *)&pipe_stdout_parent.pipe_fname,(uv_buf_t *)&r,
                   1,write_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x809,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start((uv_stream_t *)(ubuf + 0x3f8),on_alloc,on_read);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x80c,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(loop_00,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x80f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x811,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x812,"3","==","close_cb_called",3,"==",(long)close_cb_called);
    abort();
  }
  iVar1 = memcmp(&buf.len,output,0x3ff);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x815,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x817,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  uv_os_fd_t fds_stdin[2];
  uv_os_fd_t fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_child, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdin_parent, 0));
  ASSERT_OK(uv_pipe_init(loop, &pipe_stdout_parent, 0));

  ASSERT_OK(uv_pipe(fds_stdin, 0, 0));
  ASSERT_OK(uv_pipe(fds_stdout, 0, 0));

  ASSERT_OK(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]));
  ASSERT_OK(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdout_child), bidir);
  ASSERT_EQ(uv_is_readable((uv_stream_t*) &pipe_stdin_parent), bidir);
  ASSERT_EQ(uv_is_writable((uv_stream_t*) &pipe_stdout_parent), bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT_OK(uv_spawn(loop, &child_req, &options));

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}